

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtConvexConcaveCollisionAlgorithm::processCollision
          (cbtConvexConcaveCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtConvexTriangleCallback *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 uVar4;
  cbtCollisionShape *pcVar5;
  cbtTransform *pcVar6;
  cbtTransform *pcVar7;
  cbtCollisionObject *pcVar8;
  cbtCollisionObject *pcVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  cbtVector3 *pcVar16;
  int iVar17;
  long lVar18;
  int v;
  ulong uVar19;
  long lVar20;
  cbtCollisionObject *pcVar21;
  cbtPersistentManifold *pcVar22;
  cbtSphereShape *sphere;
  cbtCollisionObjectWrapper *triBodyWrap;
  cbtScalar in_XMM0_Da;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  CProfileSample __profile;
  cbtAlignedObjectArray<cbtVector3> queryVertices;
  cbtScalar dist;
  cbtConcaveShape *concaveShape;
  cbtVector3 normalLocal;
  cbtVector3 vtx;
  cbtVector3 normal;
  CProfileSample local_e9;
  cbtManifoldResult *local_e8;
  cbtAlignedObjectArray<cbtVector3> local_e0;
  float local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  cbtSdfCollisionShape *local_a0;
  cbtVector3 local_98;
  cbtVector3 local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  local_b8._8_8_ = local_b8._0_8_;
  local_e8 = resultOut;
  CProfileSample::CProfileSample(&local_e9,"cbtConvexConcaveCollisionAlgorithm::processCollision");
  local_b8._0_8_ = this;
  triBodyWrap = body1Wrap;
  if (this->m_isSwapped != false) {
    triBodyWrap = body0Wrap;
    body0Wrap = body1Wrap;
  }
  local_a0 = (cbtSdfCollisionShape *)triBodyWrap->m_shape;
  iVar14 = (local_a0->super_cbtConcaveShape).super_cbtCollisionShape.m_shapeType;
  if (iVar14 - 0x19U < 0xb) {
    pcVar5 = body0Wrap->m_shape;
    iVar17 = pcVar5->m_shapeType;
    if (iVar14 == 0x23) {
      if (iVar17 < 0x18) {
        local_e0.m_ownsMemory = true;
        local_e0.m_data = (cbtVector3 *)0x0;
        local_e0.m_size = 0;
        local_e0.m_capacity = 0;
        uVar15 = 0;
        if (iVar17 < 7) {
          uVar19 = 0;
          while( true ) {
            iVar14 = (*pcVar5->_vptr_cbtCollisionShape[0x19])(pcVar5);
            if (iVar14 <= (int)uVar19) break;
            (*pcVar5->_vptr_cbtCollisionShape[0x1c])(pcVar5,uVar19,&local_88);
            uVar15 = local_e0.m_size;
            if (local_e0.m_size == local_e0.m_capacity) {
              iVar14 = local_e0.m_size * 2;
              if (local_e0.m_size == 0) {
                iVar14 = 1;
              }
              if (local_e0.m_size < iVar14) {
                if (iVar14 == 0) {
                  pcVar16 = (cbtVector3 *)0x0;
                }
                else {
                  pcVar16 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar14 << 4,0x10);
                }
                if (0 < local_e0.m_size) {
                  lVar18 = 0;
                  do {
                    puVar1 = (undefined8 *)((long)(local_e0.m_data)->m_floats + lVar18);
                    uVar4 = puVar1[1];
                    puVar2 = (undefined8 *)((long)pcVar16->m_floats + lVar18);
                    *puVar2 = *puVar1;
                    puVar2[1] = uVar4;
                    lVar18 = lVar18 + 0x10;
                  } while ((ulong)(uint)local_e0.m_size << 4 != lVar18);
                }
                if ((local_e0.m_data != (cbtVector3 *)0x0) && (local_e0.m_ownsMemory == true)) {
                  cbtAlignedFreeInternal(local_e0.m_data);
                }
                local_e0.m_ownsMemory = true;
                local_e0.m_capacity = iVar14;
                uVar15 = local_e0.m_size;
                local_e0.m_data = pcVar16;
              }
            }
            uVar19 = (ulong)((int)uVar19 + 1);
            *(undefined8 *)local_e0.m_data[(int)uVar15].m_floats = local_88.m_floats._0_8_;
            *(undefined8 *)(local_e0.m_data[(int)uVar15].m_floats + 2) = local_88.m_floats._8_8_;
            local_e0.m_size = local_e0.m_size + 1;
          }
          iVar17 = pcVar5->m_shapeType;
          uVar15 = local_e0.m_size;
        }
        if (iVar17 == 8) {
          if (uVar15 == local_e0.m_capacity) {
            iVar14 = 1;
            if (uVar15 != 0) {
              iVar14 = uVar15 * 2;
            }
            if ((int)uVar15 < iVar14) {
              if (iVar14 == 0) {
                pcVar16 = (cbtVector3 *)0x0;
              }
              else {
                pcVar16 = (cbtVector3 *)cbtAlignedAllocInternal((long)iVar14 << 4,0x10);
                uVar15 = local_e0.m_size;
              }
              if (0 < (int)uVar15) {
                lVar18 = 0;
                do {
                  puVar1 = (undefined8 *)((long)(local_e0.m_data)->m_floats + lVar18);
                  uVar4 = puVar1[1];
                  puVar2 = (undefined8 *)((long)pcVar16->m_floats + lVar18);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar4;
                  lVar18 = lVar18 + 0x10;
                } while ((ulong)uVar15 << 4 != lVar18);
              }
              if ((local_e0.m_data != (cbtVector3 *)0x0) && (local_e0.m_ownsMemory == true)) {
                cbtAlignedFreeInternal(local_e0.m_data);
              }
              local_e0.m_ownsMemory = true;
              local_e0.m_capacity = iVar14;
              uVar15 = local_e0.m_size;
              local_e0.m_data = pcVar16;
            }
          }
          pcVar16 = local_e0.m_data + (int)uVar15;
          pcVar16->m_floats[0] = 0.0;
          pcVar16->m_floats[1] = 0.0;
          pcVar16->m_floats[2] = 0.0;
          pcVar16->m_floats[3] = 0.0;
          uVar15 = local_e0.m_size + 1;
          local_e0.m_size = uVar15;
          local_c0 = *(float *)&pcVar5[1].field_0xc * *(float *)&pcVar5->field_0x1c + 1.1920929e-07;
        }
        else {
          local_c0 = 1.1920929e-07;
        }
        if (uVar15 != 0) {
          pcVar22 = *(cbtPersistentManifold **)(local_b8._0_8_ + 0x68);
          local_e8->m_manifoldPtr = pcVar22;
          if (0 < (int)uVar15) {
            lVar18 = 8;
            lVar20 = 0;
            do {
              pcVar6 = body0Wrap->m_worldTransform;
              fVar27 = *(float *)((long)(local_e0.m_data)->m_floats + lVar18 + -4);
              uVar15 = *(uint *)((long)(local_e0.m_data)->m_floats + lVar18 + -8);
              uVar3 = *(uint *)((long)(local_e0.m_data)->m_floats + lVar18);
              pcVar7 = triBodyWrap->m_worldTransform;
              auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * (pcVar6->m_basis).m_el[0].m_floats
                                                                [1])),ZEXT416(uVar15),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[0]));
              auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * (pcVar6->m_basis).m_el[1].m_floats
                                                                [1])),ZEXT416(uVar15),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[0]));
              auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * (pcVar6->m_basis).m_el[2].m_floats
                                                                [1])),ZEXT416(uVar15),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[0]));
              auVar26._8_8_ = 0;
              auVar26._0_8_ = *(ulong *)(pcVar7->m_basis).m_el[2].m_floats;
              auVar28 = vfmadd231ss_fma(auVar28,ZEXT416(uVar3),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
              auVar29 = vfmadd231ss_fma(auVar29,ZEXT416(uVar3),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[2]));
              auVar23 = vfmadd231ss_fma(auVar23,ZEXT416(uVar3),
                                        ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
              fVar27 = auVar28._0_4_ + (pcVar6->m_origin).m_floats[0];
              fVar10 = auVar29._0_4_ + (pcVar6->m_origin).m_floats[1];
              fVar11 = auVar23._0_4_ + (pcVar6->m_origin).m_floats[2];
              uVar4 = *(undefined8 *)(pcVar7->m_basis).m_el[1].m_floats;
              fVar12 = fVar10 - (pcVar7->m_origin).m_floats[1];
              local_b8 = ZEXT416((uint)fVar27);
              fVar27 = fVar27 - (pcVar7->m_origin).m_floats[0];
              local_68 = ZEXT416((uint)fVar10);
              local_78 = ZEXT416((uint)fVar11);
              fVar11 = fVar11 - (pcVar7->m_origin).m_floats[2];
              auVar23._8_8_ = 0;
              auVar23._0_8_ = *(ulong *)(pcVar7->m_basis).m_el[0].m_floats;
              auVar25._0_4_ = fVar12 * (float)uVar4;
              auVar25._4_4_ = fVar12 * (float)((ulong)uVar4 >> 0x20);
              auVar25._8_4_ = fVar12 * 0.0;
              auVar25._12_4_ = fVar12 * 0.0;
              auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (pcVar7->m_basis).m_el[1].m_floats
                                                                [2])),ZEXT416((uint)fVar27),
                                        ZEXT416((uint)(pcVar7->m_basis).m_el[0].m_floats[2]));
              auVar29 = vfmadd231ss_fma(auVar28,ZEXT416((uint)fVar11),
                                        ZEXT416((uint)(pcVar7->m_basis).m_el[2].m_floats[2]));
              auVar28._4_4_ = fVar27;
              auVar28._0_4_ = fVar27;
              auVar28._8_4_ = fVar27;
              auVar28._12_4_ = fVar27;
              auVar28 = vfmadd213ps_fma(auVar28,auVar23,auVar25);
              auVar24._4_4_ = fVar11;
              auVar24._0_4_ = fVar11;
              auVar24._8_4_ = fVar11;
              auVar24._12_4_ = fVar11;
              auVar28 = vfmadd213ps_fma(auVar24,auVar26,auVar28);
              local_88.m_floats = (cbtScalar  [4])vinsertps_avx(auVar28,auVar29,0x28);
              bVar13 = cbtSdfCollisionShape::queryPoint(local_a0,&local_88,&local_bc,&local_98);
              if (bVar13 && local_bc <= local_c0) {
                auVar28 = vfmadd231ss_fma(ZEXT416((uint)(local_98.m_floats[1] * local_98.m_floats[1]
                                                        )),ZEXT416((uint)local_98.m_floats[0]),
                                          ZEXT416((uint)local_98.m_floats[0]));
                auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)local_98.m_floats[2]),
                                          ZEXT416((uint)local_98.m_floats[2]));
                if (1.4210855e-14 <= auVar28._0_4_) {
                  auVar28 = vsqrtss_avx(auVar28,auVar28);
                  fVar27 = 1.0 / auVar28._0_4_;
                  auVar28 = ZEXT416((uint)(local_98.m_floats[0] * fVar27));
                  local_98.m_floats[1] = local_98.m_floats[1] * fVar27;
                  auVar29 = ZEXT416((uint)(local_98.m_floats[2] * fVar27));
                }
                else {
                  auVar28 = SUB6416(ZEXT464(0x3f800000),0);
                  local_98.m_floats[1] = 0.0;
                  auVar29 = ZEXT816(0) << 0x40;
                  local_98.m_floats[3] = 0.0;
                }
                local_98.m_floats[0] = auVar28._0_4_;
                local_98.m_floats[2] = auVar29._0_4_;
                pcVar6 = triBodyWrap->m_worldTransform;
                fVar27 = local_78._0_4_;
                auVar23 = vfmadd231ss_fma(ZEXT416((uint)(local_98.m_floats[1] *
                                                        (pcVar6->m_basis).m_el[0].m_floats[1])),
                                          auVar28,ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats
                                                                [0]));
                auVar24 = vfmadd231ss_fma(ZEXT416((uint)(local_98.m_floats[1] *
                                                        (pcVar6->m_basis).m_el[1].m_floats[1])),
                                          auVar28,ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats
                                                                [0]));
                auVar28 = vfmadd231ss_fma(ZEXT416((uint)(local_98.m_floats[1] *
                                                        (pcVar6->m_basis).m_el[2].m_floats[1])),
                                          auVar28,ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats
                                                                [0]));
                auVar23 = vfmadd231ss_fma(auVar23,auVar29,
                                          ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
                auVar24 = vfmadd231ss_fma(auVar24,auVar29,
                                          ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[2]));
                auVar29 = vfmadd231ss_fma(auVar28,auVar29,
                                          ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
                auVar28 = vinsertps_avx(auVar23,auVar24,0x10);
                local_40 = vinsertps_avx(auVar28,auVar29,0x28);
                if (pcVar5->m_shapeType == 8) {
                  fVar10 = *(float *)&pcVar5[1].field_0xc * *(float *)&pcVar5->field_0x1c;
                  local_bc = local_bc - fVar10;
                  auVar28 = vinsertps_avx(ZEXT416((uint)((float)local_b8._0_4_ -
                                                        fVar10 * auVar23._0_4_)),
                                          ZEXT416((uint)((float)local_68._0_4_ -
                                                        fVar10 * auVar24._0_4_)),0x10);
                  fVar27 = fVar27 - fVar10 * auVar29._0_4_;
                }
                else {
                  auVar28 = vinsertps_avx(local_b8,ZEXT416((uint)local_68._0_4_),0x10);
                }
                auVar25 = vmovshdup_avx(auVar28);
                auVar28 = vinsertps_avx(ZEXT416((uint)(auVar28._0_4_ - auVar23._0_4_ * local_bc)),
                                        ZEXT416((uint)(auVar25._0_4_ - local_bc * auVar24._0_4_)),
                                        0x10);
                local_50 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar27 - local_bc * auVar29._0_4_)),
                                         0x28);
                (*(local_e8->super_Result)._vptr_Result[4])(local_e8,local_40,local_50);
              }
              lVar20 = lVar20 + 1;
              lVar18 = lVar18 + 0x10;
            } while (lVar20 < local_e0.m_size);
            pcVar22 = local_e8->m_manifoldPtr;
          }
          if (pcVar22->m_cachedPoints != 0) {
            pcVar8 = local_e8->m_body0Wrap->m_collisionObject;
            pcVar9 = local_e8->m_body1Wrap->m_collisionObject;
            pcVar21 = pcVar9;
            if (pcVar22->m_body0 == pcVar8) {
              pcVar21 = pcVar8;
              pcVar8 = pcVar9;
            }
            cbtPersistentManifold::refreshContactPoints
                      (pcVar22,&pcVar21->m_worldTransform,&pcVar8->m_worldTransform);
          }
        }
        cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_e0);
      }
    }
    else if (iVar17 < 0x18) {
      (*(local_a0->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
      this_00 = (cbtConvexTriangleCallback *)(local_b8._0_8_ + 0x10);
      local_e8->m_manifoldPtr = *(cbtPersistentManifold **)(local_b8._0_8_ + 0x68);
      cbtConvexTriangleCallback::setTimeStepAndCounters
                (this_00,in_XMM0_Da,dispatchInfo,body0Wrap,triBodyWrap,local_e8);
      pcVar8 = triBodyWrap->m_collisionObject;
      lVar18 = *(long *)(local_b8._0_8_ + 0x68);
      *(cbtCollisionObject **)(lVar18 + 0x388) = body0Wrap->m_collisionObject;
      *(cbtCollisionObject **)(lVar18 + 0x390) = pcVar8;
      (*(local_a0->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
                (local_a0,this_00,local_b8._0_8_ + 0x18,local_b8._0_8_ + 0x28);
      pcVar22 = local_e8->m_manifoldPtr;
      if (pcVar22->m_cachedPoints != 0) {
        pcVar8 = local_e8->m_body0Wrap->m_collisionObject;
        pcVar9 = local_e8->m_body1Wrap->m_collisionObject;
        pcVar21 = pcVar9;
        if (pcVar22->m_body0 == pcVar8) {
          pcVar21 = pcVar8;
          pcVar8 = pcVar9;
        }
        cbtPersistentManifold::refreshContactPoints
                  (pcVar22,&pcVar21->m_worldTransform,&pcVar8->m_worldTransform);
      }
      *(undefined8 *)(local_b8._0_8_ + 0x38) = 0;
      *(undefined8 *)(local_b8._0_8_ + 0x40) = 0;
    }
  }
  CProfileSample::~CProfileSample(&local_e9);
  return;
}

Assistant:

void cbtConvexConcaveCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	BT_PROFILE("cbtConvexConcaveCollisionAlgorithm::processCollision");

	const cbtCollisionObjectWrapper* convexBodyWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* triBodyWrap = m_isSwapped ? body0Wrap : body1Wrap;

	if (triBodyWrap->getCollisionShape()->isConcave())
	{
		if (triBodyWrap->getCollisionShape()->getShapeType() == SDF_SHAPE_PROXYTYPE)
		{
			cbtSdfCollisionShape* sdfShape = (cbtSdfCollisionShape*)triBodyWrap->getCollisionShape();
			if (convexBodyWrap->getCollisionShape()->isConvex())
			{
				cbtConvexShape* convex = (cbtConvexShape*)convexBodyWrap->getCollisionShape();
				cbtAlignedObjectArray<cbtVector3> queryVertices;

				if (convex->isPolyhedral())
				{
					cbtPolyhedralConvexShape* poly = (cbtPolyhedralConvexShape*)convex;
					for (int v = 0; v < poly->getNumVertices(); v++)
					{
						cbtVector3 vtx;
						poly->getVertex(v, vtx);
						queryVertices.push_back(vtx);
					}
				}
				cbtScalar maxDist = SIMD_EPSILON;

				if (convex->getShapeType() == SPHERE_SHAPE_PROXYTYPE)
				{
					queryVertices.push_back(cbtVector3(0, 0, 0));
					cbtSphereShape* sphere = (cbtSphereShape*)convex;
					maxDist = sphere->getRadius() + SIMD_EPSILON;
				}
				if (queryVertices.size())
				{
					resultOut->setPersistentManifold(m_cbtConvexTriangleCallback.m_manifoldPtr);
					//m_cbtConvexTriangleCallback.m_manifoldPtr->clearManifold();

					cbtPolyhedralConvexShape* poly = (cbtPolyhedralConvexShape*)convex;
					for (int v = 0; v < queryVertices.size(); v++)
					{
						const cbtVector3& vtx = queryVertices[v];
						cbtVector3 vtxWorldSpace = convexBodyWrap->getWorldTransform() * vtx;
						cbtVector3 vtxInSdf = triBodyWrap->getWorldTransform().invXform(vtxWorldSpace);

						cbtVector3 normalLocal;
						cbtScalar dist;
						if (sdfShape->queryPoint(vtxInSdf, dist, normalLocal))
						{
							if (dist <= maxDist)
							{
								normalLocal.safeNormalize();
								cbtVector3 normal = triBodyWrap->getWorldTransform().getBasis() * normalLocal;

								if (convex->getShapeType() == SPHERE_SHAPE_PROXYTYPE)
								{
									cbtSphereShape* sphere = (cbtSphereShape*)convex;
									dist -= sphere->getRadius();
									vtxWorldSpace -= sphere->getRadius() * normal;
								}
								resultOut->addContactPoint(normal, vtxWorldSpace - normal * dist, dist);
							}
						}
					}
					resultOut->refreshContactPoints();
				}
			}
		}
		else
		{
			const cbtConcaveShape* concaveShape = static_cast<const cbtConcaveShape*>(triBodyWrap->getCollisionShape());

			if (convexBodyWrap->getCollisionShape()->isConvex())
			{
				cbtScalar collisionMarginTriangle = concaveShape->getMargin();

				resultOut->setPersistentManifold(m_cbtConvexTriangleCallback.m_manifoldPtr);
				m_cbtConvexTriangleCallback.setTimeStepAndCounters(collisionMarginTriangle, dispatchInfo, convexBodyWrap, triBodyWrap, resultOut);

				m_cbtConvexTriangleCallback.m_manifoldPtr->setBodies(convexBodyWrap->getCollisionObject(), triBodyWrap->getCollisionObject());

				concaveShape->processAllTriangles(&m_cbtConvexTriangleCallback, m_cbtConvexTriangleCallback.getAabbMin(), m_cbtConvexTriangleCallback.getAabbMax());

				resultOut->refreshContactPoints();

				m_cbtConvexTriangleCallback.clearWrapperData();
			}
		}
	}
}